

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerReflection::emit_resources(CompilerReflection *this)

{
  ShaderResources res;
  ShaderResources local_1350;
  
  Compiler::get_shader_resources(&local_1350,(Compiler *)this);
  emit_resources(this,"subpass_inputs",&local_1350.subpass_inputs);
  emit_resources(this,"inputs",&local_1350.stage_inputs);
  emit_resources(this,"outputs",&local_1350.stage_outputs);
  emit_resources(this,"textures",&local_1350.sampled_images);
  emit_resources(this,"separate_images",&local_1350.separate_images);
  emit_resources(this,"separate_samplers",&local_1350.separate_samplers);
  emit_resources(this,"images",&local_1350.storage_images);
  emit_resources(this,"ssbos",&local_1350.storage_buffers);
  emit_resources(this,"ubos",&local_1350.uniform_buffers);
  emit_resources(this,"push_constants",&local_1350.push_constant_buffers);
  emit_resources(this,"counters",&local_1350.atomic_counters);
  emit_resources(this,"acceleration_structures",&local_1350.acceleration_structures);
  SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_1350.separate_samplers);
  SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_1350.separate_images);
  SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_1350.push_constant_buffers);
  SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_1350.acceleration_structures);
  SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_1350.atomic_counters);
  SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_1350.sampled_images);
  SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_1350.storage_images);
  SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_1350.subpass_inputs);
  SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_1350.stage_outputs);
  SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_1350.stage_inputs);
  SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_1350.storage_buffers);
  SmallVector<spirv_cross::Resource,_8UL>::~SmallVector(&local_1350.uniform_buffers);
  return;
}

Assistant:

void CompilerReflection::emit_resources()
{
	auto res = get_shader_resources();
	emit_resources("subpass_inputs", res.subpass_inputs);
	emit_resources("inputs", res.stage_inputs);
	emit_resources("outputs", res.stage_outputs);
	emit_resources("textures", res.sampled_images);
	emit_resources("separate_images", res.separate_images);
	emit_resources("separate_samplers", res.separate_samplers);
	emit_resources("images", res.storage_images);
	emit_resources("ssbos", res.storage_buffers);
	emit_resources("ubos", res.uniform_buffers);
	emit_resources("push_constants", res.push_constant_buffers);
	emit_resources("counters", res.atomic_counters);
	emit_resources("acceleration_structures", res.acceleration_structures);
}